

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O2

size_t ZSTD_initDStream_usingDict(ZSTD_DStream *zds,void *dict,size_t dictSize)

{
  size_t sVar1;
  
  zds->streamStage = zdss_init;
  zds->noForwardProgress = 0;
  sVar1 = ZSTD_DCtx_loadDictionary(zds,dict,dictSize);
  if (sVar1 < 0xffffffffffffff89) {
    sVar1 = (ulong)(zds->format == ZSTD_f_zstd1) * 4 + 1;
  }
  return sVar1;
}

Assistant:

size_t ZSTD_initDStream_usingDict(ZSTD_DStream* zds, const void* dict, size_t dictSize)
{
    DEBUGLOG(4, "ZSTD_initDStream_usingDict");
    FORWARD_IF_ERROR( ZSTD_DCtx_reset(zds, ZSTD_reset_session_only) , "");
    FORWARD_IF_ERROR( ZSTD_DCtx_loadDictionary(zds, dict, dictSize) , "");
    return ZSTD_startingInputLength(zds->format);
}